

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

lbool __thiscall Minisat::Solver::solve_(Solver *this)

{
  bool bVar1;
  lbool lVar2;
  int iVar3;
  lbool *plVar4;
  double local_48;
  int local_30;
  int i;
  double rest_base;
  int curr_restarts;
  Solver *this_local;
  lbool status;
  
  vec<Minisat::lbool,_int>::clear(&this->model,false);
  IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
            (&(this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>,false);
  if ((this->ok & 1U) == 0) {
    this_local._7_1_ = l_False.value;
  }
  else {
    this->solves = this->solves + 1;
    iVar3 = nClauses(this);
    this->max_learnts = (double)iVar3 * this->learntsize_factor;
    if (this->max_learnts < (double)this->min_learnts_lim) {
      this->max_learnts = (double)this->min_learnts_lim;
    }
    this->learntsize_adjust_confl = (double)this->learntsize_adjust_start_confl;
    this->learntsize_adjust_cnt = (int)this->learntsize_adjust_confl;
    this_local._7_1_ = l_Undef.value;
    if (0 < this->verbosity) {
      printf("============================[ Search Statistics ]==============================\n");
      printf("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
      printf("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
      printf("===============================================================================\n");
    }
    rest_base._4_4_ = 0;
    while (bVar1 = lbool::operator==((lbool *)((long)&this_local + 7),l_Undef), bVar1) {
      if ((this->luby_restart & 1U) == 0) {
        local_48 = std::pow<double,int>(this->restart_inc,rest_base._4_4_);
      }
      else {
        local_48 = luby(this->restart_inc,rest_base._4_4_);
      }
      this_local._7_1_ = search(this,(int)(local_48 * (double)this->restart_first));
      bVar1 = withinBudget(this);
      if (!bVar1) break;
      rest_base._4_4_ = rest_base._4_4_ + 1;
    }
    if (0 < this->verbosity) {
      printf("===============================================================================\n");
    }
    bVar1 = lbool::operator==((lbool *)((long)&this_local + 7),l_True);
    if (bVar1) {
      iVar3 = nVars(this);
      vec<Minisat::lbool,_int>::growTo(&this->model,iVar3);
      for (local_30 = 0; iVar3 = nVars(this), local_30 < iVar3; local_30 = local_30 + 1) {
        lVar2 = value(this,local_30);
        plVar4 = vec<Minisat::lbool,_int>::operator[](&this->model,local_30);
        plVar4->value = lVar2.value;
      }
    }
    else {
      bVar1 = lbool::operator==((lbool *)((long)&this_local + 7),l_False);
      if ((bVar1) &&
         (iVar3 = IntSet<Minisat::Lit,_Minisat::MkIndexLit>::size
                            (&(this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>),
         iVar3 == 0)) {
        this->ok = false;
      }
    }
    cancelUntil(this,0);
  }
  return (lbool)this_local._7_1_;
}

Assistant:

lbool Solver::solve_()
{
    model.clear();
    conflict.clear();
    if (!ok) return l_False;

    solves++;

    max_learnts = nClauses() * learntsize_factor;
    if (max_learnts < min_learnts_lim)
        max_learnts = min_learnts_lim;

    learntsize_adjust_confl   = learntsize_adjust_start_confl;
    learntsize_adjust_cnt     = (int)learntsize_adjust_confl;
    lbool   status            = l_Undef;

    if (verbosity >= 1){
        printf("============================[ Search Statistics ]==============================\n");
        printf("| Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
        printf("|           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
        printf("===============================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
        double rest_base = luby_restart ? luby(restart_inc, curr_restarts) : pow(restart_inc, curr_restarts);
        status = search(rest_base * restart_first);
        if (!withinBudget()) break;
        curr_restarts++;
    }

    if (verbosity >= 1)
        printf("===============================================================================\n");


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);
    return status;
}